

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# forkfd.c
# Opt level: O2

int forkfd_fork_fallback(int flags,pid_t *ppid)

{
  ffd_atomic_int *pfVar1;
  long lVar2;
  int iVar3;
  int iVar4;
  __pid_t _Var5;
  int iVar6;
  ProcessInfo *pPVar7;
  BigArray *__ptr;
  BigArray *pBVar8;
  ssize_t sVar9;
  int *piVar10;
  SmallArray *header;
  long in_FS_OFFSET;
  bool bVar11;
  eventfd_t val64;
  int sync_pipe [2];
  int death_pipe [2];
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  death_pipe = (int  [2])&DAT_aaaaaaaaaaaaaaaa;
  sync_pipe = (int  [2])&DAT_aaaaaaaaaaaaaaaa;
  pthread_once(&forkfd_initialization,forkfd_initialize);
  header = &children;
  pPVar7 = tryAllocateInSection(&children.header,children.entries,0x10);
  while (pPVar7 == (ProcessInfo *)0x0) {
    __ptr = (((BigArray *)header)->header).nextArray;
    if (__ptr == (BigArray *)0x0) {
      __ptr = (BigArray *)calloc(1,0x810);
      if (__ptr == (BigArray *)0x0) {
        piVar10 = __errno_location();
        *piVar10 = 0xc;
        goto LAB_003e5e97;
      }
      LOCK();
      pBVar8 = (((BigArray *)header)->header).nextArray;
      bVar11 = pBVar8 == (BigArray *)0x0;
      if (bVar11) {
        (((BigArray *)header)->header).nextArray = __ptr;
        pBVar8 = (BigArray *)0x0;
      }
      UNLOCK();
      if (!bVar11) {
        free(__ptr);
        __ptr = pBVar8;
      }
    }
    header = (SmallArray *)__ptr;
    pPVar7 = tryAllocateInSection(&header->header,((BigArray *)header)->entries,0x100);
  }
  iVar3 = create_pipe(death_pipe,flags);
  if (iVar3 != -1) {
    iVar3 = eventfd(0,0x80000);
    if ((iVar3 != -1) || (iVar4 = create_pipe(sync_pipe,1), iVar4 != -1)) {
      _Var5 = fork();
      if (_Var5 != -1) {
        if (ppid != (pid_t *)0x0) {
          *ppid = _Var5;
        }
        if (_Var5 == 0) {
          if (iVar3 == -1) {
            val64 = CONCAT71(val64._1_7_,0xaa);
            do {
              iVar3 = close(sync_pipe[1]);
              if (iVar3 != -1) break;
              piVar10 = __errno_location();
            } while (*piVar10 == 4);
            do {
              sVar9 = read(sync_pipe[0],&val64,1);
              if ((int)sVar9 != -1) break;
              piVar10 = __errno_location();
            } while (*piVar10 == 4);
            do {
              iVar3 = close(sync_pipe[0]);
              if (iVar3 != -1) break;
              piVar10 = __errno_location();
            } while (*piVar10 == 4);
          }
          else {
            val64 = (eventfd_t)&DAT_aaaaaaaaaaaaaaaa;
            do {
              iVar4 = eventfd_read(iVar3,&val64);
              if (iVar4 != -1) break;
              piVar10 = __errno_location();
            } while (*piVar10 == 4);
            do {
              iVar4 = close(iVar3);
              if (iVar4 != -1) break;
              piVar10 = __errno_location();
            } while (*piVar10 == 4);
          }
          do {
            iVar3 = close(death_pipe[0]);
            if (iVar3 != -1) break;
            piVar10 = __errno_location();
          } while (*piVar10 == 4);
          iVar4 = -2;
          do {
            iVar3 = close(death_pipe[1]);
            if (iVar3 != -1) break;
            piVar10 = __errno_location();
          } while (*piVar10 == 4);
        }
        else {
          pPVar7->deathPipe = death_pipe[1];
          iVar4 = death_pipe[0];
          pPVar7->pid = _Var5;
          if (iVar3 == -1) {
            do {
              iVar3 = close(sync_pipe[0]);
              if (iVar3 != -1) break;
              piVar10 = __errno_location();
            } while (*piVar10 == 4);
            do {
              sVar9 = write(sync_pipe[1],"",1);
              if ((int)sVar9 != -1) break;
              piVar10 = __errno_location();
            } while (*piVar10 == 4);
            do {
              iVar3 = close(sync_pipe[1]);
              if (iVar3 != -1) break;
              piVar10 = __errno_location();
            } while (*piVar10 == 4);
          }
          else {
            do {
              iVar6 = eventfd_write(iVar3,0x2a);
              if (iVar6 != -1) break;
              piVar10 = __errno_location();
            } while (*piVar10 == 4);
            do {
              iVar6 = close(iVar3);
              if (iVar6 != -1) break;
              piVar10 = __errno_location();
            } while (*piVar10 == 4);
          }
        }
        goto LAB_003e5e9a;
      }
      if (iVar3 == -1) {
        do {
          iVar3 = close(sync_pipe[0]);
          if (iVar3 != -1) break;
          piVar10 = __errno_location();
        } while (*piVar10 == 4);
        do {
          iVar3 = close(sync_pipe[1]);
          if (iVar3 != -1) break;
          piVar10 = __errno_location();
        } while (*piVar10 == 4);
      }
      else {
        do {
          iVar4 = close(iVar3);
          if (iVar4 != -1) break;
          piVar10 = __errno_location();
        } while (*piVar10 == 4);
      }
    }
    do {
      iVar3 = close(death_pipe[0]);
      if (iVar3 != -1) break;
      piVar10 = __errno_location();
    } while (*piVar10 == 4);
    do {
      iVar3 = close(death_pipe[1]);
      if (iVar3 != -1) break;
      piVar10 = __errno_location();
    } while (*piVar10 == 4);
  }
  pPVar7->deathPipe = -1;
  pPVar7->pid = 0;
  LOCK();
  pfVar1 = &(((BigArray *)header)->header).busyCount;
  *pfVar1 = *pfVar1 + -1;
  UNLOCK();
LAB_003e5e97:
  iVar4 = -1;
LAB_003e5e9a:
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar2) {
    __stack_chk_fail();
  }
  return iVar4;
}

Assistant:

static int forkfd_fork_fallback(int flags, pid_t *ppid)
{
    Header *header;
    ProcessInfo *info;
    pid_t pid;
    int fd = -1;
    int death_pipe[2];
    int sync_pipe[2];
    int ret;
    int efd = -1;

    (void) pthread_once(&forkfd_initialization, forkfd_initialize);

    info = allocateInfo(&header);
    if (info == NULL) {
        errno = ENOMEM;
        return -1;
    }

    /* create the pipes before we fork */
    if (create_pipe(death_pipe, flags) == -1)
        goto err_free; /* failed to create the pipes, pass errno */

#ifdef HAVE_EVENTFD
    /* try using an eventfd, which consumes less resources */
    efd = eventfd(0, EFD_CLOEXEC);
#endif
    if (efd == -1) {
        /* try a pipe */
        if (create_pipe(sync_pipe, FFD_CLOEXEC) == -1) {
            /* failed both at eventfd and pipe; fail and pass errno */
            goto err_close;
        }
    }

    /* now fork */
    pid = fork();
    if (pid == -1)
        goto err_close2; /* failed to fork, pass errno */
    if (ppid)
        *ppid = pid;

    /*
     * We need to store the child's PID in the info structure, so
     * the SIGCHLD handler knows that this child is present and it
     * knows the writing end of the pipe to pass information on.
     * However, the child process could exit before we stored the
     * information (or the handler could run for other children exiting).
     * We prevent that from happening by blocking the child process in
     * a read(2) until we're finished storing the information.
     */
    if (pid == 0) {
        /* this is the child process */
        /* first, wait for the all clear */
        if (efd != -1) {
#ifdef HAVE_EVENTFD
            eventfd_t val64;
            EINTR_LOOP(ret, eventfd_read(efd, &val64));
            EINTR_LOOP(ret, close(efd));
#endif
        } else {
            char c;
            EINTR_LOOP(ret, close(sync_pipe[1]));
            EINTR_LOOP(ret, read(sync_pipe[0], &c, sizeof c));
            EINTR_LOOP(ret, close(sync_pipe[0]));
        }

        /* now close the pipes and return to the caller */
        EINTR_LOOP(ret, close(death_pipe[0]));
        EINTR_LOOP(ret, close(death_pipe[1]));
        fd = FFD_CHILD_PROCESS;
    } else {
        /* parent process */
        info->deathPipe = death_pipe[1];
        fd = death_pipe[0];
        ffd_atomic_store(&info->pid, pid, FFD_ATOMIC_RELEASE);

        /* release the child */
#ifdef HAVE_EVENTFD
        if (efd != -1) {
            eventfd_t val64 = 42;
            EINTR_LOOP(ret, eventfd_write(efd, val64));
            EINTR_LOOP(ret, close(efd));
        } else
#endif
        {
            /*
             * Usually, closing would be enough to make read(2) return and the child process
             * continue. We need to write here: another thread could be calling forkfd at the
             * same time, which means auxpipe[1] might be open in another child process.
             */
            EINTR_LOOP(ret, close(sync_pipe[0]));
            EINTR_LOOP(ret, write(sync_pipe[1], "", 1));
            EINTR_LOOP(ret, close(sync_pipe[1]));
        }
    }

    return fd;

err_close2:
#ifdef HAVE_EVENTFD
    if (efd != -1) {
        EINTR_LOOP(ret, close(efd));
    } else
#endif
    {
        EINTR_LOOP(ret, close(sync_pipe[0]));
        EINTR_LOOP(ret, close(sync_pipe[1]));
    }
err_close:
    EINTR_LOOP(ret, close(death_pipe[0]));
    EINTR_LOOP(ret, close(death_pipe[1]));
err_free:
    /* free the info pointer */
    freeInfo(header, info);
    return -1;
}